

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O3

CopyResult __thiscall
absl::lts_20250127::cord_internal::CordRepBtree::CopyPrefix
          (CordRepBtree *this,size_t n,bool allow_folding)

{
  RefcountAndFlags *pRVar1;
  int *piVar2;
  byte bVar3;
  uint8_t uVar4;
  long lVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  ulong uVar11;
  CordRepBtree *tree;
  long lVar12;
  ulong uVar13;
  CordRepBtree *pCVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  CordRepBtree *pCVar18;
  ulong uVar19;
  ulong uVar20;
  size_t sVar21;
  int iVar22;
  uint uVar23;
  CopyResult CVar24;
  
  if (n == 0) {
    __assert_fail("n > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                  ,0x2f7,"CopyResult absl::cord_internal::CordRepBtree::CopyPrefix(size_t, bool)");
  }
  sVar21 = (this->super_CordRep).length;
  if (sVar21 < n) {
    __assert_fail("n <= this->length",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                  ,0x2f8,"CopyResult absl::cord_internal::CordRepBtree::CopyPrefix(size_t, bool)");
  }
  bVar3 = (this->super_CordRep).storage[0];
  uVar23 = (uint)bVar3;
  if (allow_folding) {
    tree = (CordRepBtree *)this->edges_[(this->super_CordRep).storage[1]];
    uVar16 = (tree->super_CordRep).length;
    if (n <= uVar16) {
      if (bVar3 != 0) {
        iVar22 = uVar23 + 1;
        this = tree;
        do {
          if ((this->super_CordRep).tag != '\x03') goto LAB_0036bcaf;
          tree = (CordRepBtree *)this->edges_[(this->super_CordRep).storage[1]];
          uVar16 = (tree->super_CordRep).length;
          if (uVar16 < n) {
            sVar21 = (this->super_CordRep).length;
            uVar23 = iVar22 - 2;
            goto LAB_0036b991;
          }
          iVar22 = iVar22 + -1;
          this = tree;
        } while (1 < iVar22);
      }
      LOCK();
      pRVar1 = &(tree->super_CordRep).refcount;
      (pRVar1->count_).super___atomic_base<int>._M_i =
           (pRVar1->count_).super___atomic_base<int>._M_i + 2;
      UNLOCK();
      uVar23 = 0xffffffff;
      if (uVar16 != n) {
        tree = (CordRepBtree *)anon_unknown_0::CreateSubstring(&tree->super_CordRep,0,n);
      }
      goto LAB_0036bc48;
    }
  }
LAB_0036b991:
  if (sVar21 == n) {
    LOCK();
    pRVar1 = &(this->super_CordRep).refcount;
    (pRVar1->count_).super___atomic_base<int>._M_i =
         (pRVar1->count_).super___atomic_base<int>._M_i + 2;
    UNLOCK();
    tree = this;
  }
  else {
    if (sVar21 <= n) {
LAB_0036bd0c:
      __assert_fail("offset < length",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                    ,0x329,
                    "CordRepBtree::Position absl::cord_internal::CordRepBtree::IndexOf(size_t) const"
                   );
    }
    uVar11 = (ulong)(this->super_CordRep).storage[1];
    uVar16 = this->edges_[uVar11]->length;
    uVar19 = uVar11;
    uVar15 = uVar11;
    sVar21 = n;
    if (uVar16 <= n) {
      do {
        sVar21 = sVar21 - uVar16;
        uVar19 = uVar15 + 1;
        uVar16 = this->edges_[uVar15 + 1]->length;
        uVar15 = uVar19;
      } while (uVar16 <= sVar21);
    }
    if (6 < uVar19) {
LAB_0036bcce:
      __assert_fail("end <= capacity()",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                    ,0x2cb,
                    "CordRepBtree *absl::cord_internal::CordRepBtree::CopyBeginTo(size_t, size_t) const"
                   );
    }
    if (uVar19 < uVar11) {
LAB_0036bced:
      __assert_fail("end >= this->begin()",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                    ,0x2cc,
                    "CordRepBtree *absl::cord_internal::CordRepBtree::CopyBeginTo(size_t, size_t) const"
                   );
    }
    tree = (CordRepBtree *)operator_new(0x40);
    (tree->super_CordRep).refcount.count_.super___atomic_base<int>._M_i = 2;
    (tree->super_CordRep).length = n;
    uVar6 = *(undefined8 *)((long)this->edges_ + 4);
    uVar7 = *(undefined8 *)((long)this->edges_ + 0xc);
    uVar8 = *(undefined8 *)((long)this->edges_ + 0x14);
    uVar9 = *(undefined8 *)((long)this->edges_ + 0x1c);
    uVar10 = *(undefined8 *)((long)this->edges_ + 0x24);
    *(undefined8 *)&(tree->super_CordRep).tag = *(undefined8 *)&(this->super_CordRep).tag;
    *(undefined8 *)((long)tree->edges_ + 4) = uVar6;
    *(undefined8 *)((long)tree->edges_ + 0xc) = uVar7;
    *(undefined8 *)((long)tree->edges_ + 0x14) = uVar8;
    *(undefined8 *)((long)tree->edges_ + 0x1c) = uVar9;
    *(undefined8 *)((long)tree->edges_ + 0x24) = uVar10;
    *(undefined4 *)((long)tree->edges_ + 0x2c) = *(undefined4 *)((long)this->edges_ + 0x2c);
    (tree->super_CordRep).storage[2] = (uint8_t)uVar19;
    bVar3 = (tree->super_CordRep).storage[1];
    if (uVar19 != bVar3) {
      lVar12 = (ulong)bVar3 << 3;
      do {
        lVar5 = *(long *)((long)tree->edges_ + lVar12);
        if (lVar5 == 0) goto LAB_0036bc90;
        LOCK();
        piVar2 = (int *)(lVar5 + 8);
        *piVar2 = *piVar2 + 2;
        UNLOCK();
        lVar12 = lVar12 + 8;
      } while (uVar19 * 8 - lVar12 != 0);
    }
    pCVar14 = tree;
    if (sVar21 != 0) {
      pCVar18 = tree;
      uVar16 = uVar19;
      uVar17 = uVar23;
      do {
        if (uVar16 < (this->super_CordRep).storage[1]) {
          __assert_fail("index >= begin()",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                        ,0x268,"CordRep *absl::cord_internal::CordRepBtree::Edge(size_t) const");
        }
        if ((this->super_CordRep).storage[2] <= uVar16) {
          __assert_fail("index < end()",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                        ,0x269,"CordRep *absl::cord_internal::CordRepBtree::Edge(size_t) const");
        }
        this = (CordRepBtree *)this->edges_[uVar16];
        if ((int)uVar17 < 1) {
          if (this == (CordRepBtree *)0x0) {
LAB_0036bc90:
            __assert_fail("rep != nullptr",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_internal.h"
                          ,0x391,"static CordRep *absl::cord_internal::CordRep::Ref(CordRep *)");
          }
          LOCK();
          pRVar1 = &(this->super_CordRep).refcount;
          (pRVar1->count_).super___atomic_base<int>._M_i =
               (pRVar1->count_).super___atomic_base<int>._M_i + 2;
          UNLOCK();
          if ((this->super_CordRep).length != sVar21) {
            this = (CordRepBtree *)anon_unknown_0::CreateSubstring((CordRep *)this,0,sVar21);
          }
          pCVar18->edges_[uVar16] = &this->super_CordRep;
          (pCVar18->super_CordRep).storage[2] = (char)uVar16 + '\x01';
          uVar4 = (tree->super_CordRep).tag;
          goto joined_r0x0036bc31;
        }
        if ((this->super_CordRep).tag != '\x03') goto LAB_0036bcaf;
        if ((this->super_CordRep).length <= sVar21) goto LAB_0036bd0c;
        uVar13 = (ulong)(this->super_CordRep).storage[1];
        uVar15 = this->edges_[uVar13]->length;
        uVar19 = uVar13;
        uVar11 = uVar13;
        uVar20 = sVar21;
        if (uVar15 <= sVar21) {
          do {
            uVar20 = uVar20 - uVar15;
            uVar19 = uVar11 + 1;
            uVar15 = this->edges_[uVar11 + 1]->length;
            uVar11 = uVar19;
          } while (uVar15 <= uVar20);
        }
        if (6 < uVar19) goto LAB_0036bcce;
        if (uVar19 < uVar13) goto LAB_0036bced;
        pCVar14 = (CordRepBtree *)operator_new(0x40);
        (pCVar14->super_CordRep).refcount.count_.super___atomic_base<int>._M_i = 2;
        (pCVar14->super_CordRep).length = sVar21;
        uVar6 = *(undefined8 *)((long)this->edges_ + 4);
        uVar7 = *(undefined8 *)((long)this->edges_ + 0xc);
        uVar8 = *(undefined8 *)((long)this->edges_ + 0x14);
        uVar9 = *(undefined8 *)((long)this->edges_ + 0x1c);
        uVar10 = *(undefined8 *)((long)this->edges_ + 0x24);
        *(undefined8 *)&(pCVar14->super_CordRep).tag = *(undefined8 *)&(this->super_CordRep).tag;
        *(undefined8 *)((long)pCVar14->edges_ + 4) = uVar6;
        *(undefined8 *)((long)pCVar14->edges_ + 0xc) = uVar7;
        *(undefined8 *)((long)pCVar14->edges_ + 0x14) = uVar8;
        *(undefined8 *)((long)pCVar14->edges_ + 0x1c) = uVar9;
        *(undefined8 *)((long)pCVar14->edges_ + 0x24) = uVar10;
        *(undefined4 *)((long)pCVar14->edges_ + 0x2c) = *(undefined4 *)((long)this->edges_ + 0x2c);
        (pCVar14->super_CordRep).storage[2] = (uint8_t)uVar19;
        bVar3 = (pCVar14->super_CordRep).storage[1];
        if (uVar19 != bVar3) {
          lVar12 = (ulong)bVar3 << 3;
          do {
            lVar5 = *(long *)((long)pCVar14->edges_ + lVar12);
            if (lVar5 == 0) goto LAB_0036bc90;
            LOCK();
            piVar2 = (int *)(lVar5 + 8);
            *piVar2 = *piVar2 + 2;
            UNLOCK();
            lVar12 = lVar12 + 8;
          } while (uVar19 * 8 - lVar12 != 0);
        }
        uVar17 = uVar17 - 1;
        pCVar18->edges_[uVar16] = (CordRep *)pCVar14;
        (pCVar18->super_CordRep).storage[2] = (char)uVar16 + '\x01';
        pCVar18 = pCVar14;
        sVar21 = uVar20;
        uVar16 = uVar19;
      } while (uVar20 != 0);
    }
    (pCVar14->super_CordRep).storage[2] = (uint8_t)uVar19;
    uVar4 = (tree->super_CordRep).tag;
joined_r0x0036bc31:
    if (uVar4 != '\x03') {
LAB_0036bcaf:
      __assert_fail("IsBtree()",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                    ,599,"CordRepBtree *absl::cord_internal::CordRep::btree()");
    }
    AssertValid(tree,true);
  }
LAB_0036bc48:
  CVar24.height = uVar23;
  CVar24.edge = &tree->super_CordRep;
  CVar24._12_4_ = 0;
  return CVar24;
}

Assistant:

CopyResult CordRepBtree::CopyPrefix(size_t n, bool allow_folding) {
  assert(n > 0);
  assert(n <= this->length);

  // As long as `n` does not exceed the length of the first edge, we can 'drop'
  // the current depth. For the most extreme example: if we'd copy a 1 byte
  // prefix from a tree, there is only a single edge / path from the top of the
  // tree to the single data edge containing this byte, so we can drop all the
  // nodes except the data node.
  int height = this->height();
  CordRepBtree* node = this;
  CordRep* front = node->Edge(kFront);
  if (allow_folding) {
    while (front->length >= n) {
      if (--height < 0) return {MakeSubstring(CordRep::Ref(front), 0, n), -1};
      node = front->btree();
      front = node->Edge(kFront);
    }
  }
  if (node->length == n) return {CordRep::Ref(node), height};

  // `n` spans at least two nodes, find the end point of the span.
  Position pos = node->IndexOf(n);

  // Create a partial copy of the node up to `pos.index`, with a defined length
  // of `n`. Any 'partial last edge' is added further below as needed.
  CordRepBtree* sub = node->CopyBeginTo(pos.index, n);
  const CopyResult result = {sub, height};

  // `pos.n` contains the 'offset inside the edge for IndexOf(n)'. As long as
  // this is not zero, we don't have a 'clean cut', so we need to make a
  // (partial) copy of that last edge, and repeat this until pos.n is zero.
  while (pos.n != 0) {
    size_t end = pos.index;
    n = pos.n;

    CordRep* edge = node->Edge(pos.index);
    if (--height < 0) {
      sub->edges_[end++] = MakeSubstring(CordRep::Ref(edge), 0, n);
      sub->set_end(end);
      AssertValid(result.edge->btree());
      return result;
    }

    node = edge->btree();
    pos = node->IndexOf(n);
    CordRepBtree* nsub = node->CopyBeginTo(pos.index, n);
    sub->edges_[end++] = nsub;
    sub->set_end(end);
    sub = nsub;
  }
  sub->set_end(pos.index);
  AssertValid(result.edge->btree());
  return result;
}